

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

int ConnectPololux(POLOLU *pPololu,char *szCfgFilePath)

{
  int iVar1;
  int local_24;
  int res;
  int id;
  char *szCfgFilePath_local;
  POLOLU *pPololu_local;
  
  local_24 = 0;
  do {
    if (addrsPololu[local_24] == (void *)0x0) {
      iVar1 = ConnectPololu(pPololu,szCfgFilePath);
      if (iVar1 != 0) {
        return iVar1;
      }
      addrsPololu[local_24] = pPololu;
      return 0;
    }
    local_24 = local_24 + 1;
  } while (local_24 < 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int ConnectPololux(POLOLU* pPololu, char* szCfgFilePath)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsPololu[id] != NULL)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	res = ConnectPololu(pPololu, szCfgFilePath);
	if (res != EXIT_SUCCESS) return res;

	addrsPololu[id] = pPololu;

	return EXIT_SUCCESS;
}